

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetic.h
# Opt level: O2

int __thiscall FastPForLib::ZipfianGenerator::nextInt(ZipfianGenerator *this)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  double u;
  
  ZRandom::getDouble(&this->rand);
  _Var1 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,__gnu_cxx::__ops::_Iter_less_val>
                    ((this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->proba).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  return (int)((ulong)((long)_Var1._M_current -
                      (long)(this->proba).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int nextInt() {
    // Map z to the value
    const double u = rand.getDouble();
    return static_cast<int>(lower_bound(proba.begin(), proba.end(), u) -
                            proba.begin());
  }